

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O3

void anon_unknown.dwarf_177786::fill2(unsigned_short *data,int n,int m,Rand48 *rand48)

{
  long lVar1;
  double dVar2;
  
  if (0 < n) {
    memset(data,0,(ulong)(uint)(n * 2));
  }
  if (0 < m) {
    do {
      dVar2 = (double)Imath_3_2::erand48(rand48->_state);
      lVar1 = Imath_3_2::nrand48(rand48->_state);
      data[lVar1 % (long)(ulong)(uint)n] = (unsigned_short)(int)(dVar2 * 65536.0);
      m = m + -1;
    } while (m != 0);
  }
  return;
}

Assistant:

void
fill2 (
    unsigned short data[/*n*/], int n, int m, IMATH_NAMESPACE::Rand48& rand48)
{
    for (int i = 0; i < n; ++i)
        data[i] = 0;

    for (int i = 0; i < m; ++i)
        data[rand48.nexti () % n] =
            (unsigned short) (rand48.nextf () * (USHRT_MAX + 1));
}